

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_OffsetInfo ZSTD_getOffsetInfo(ZSTD_seqSymbol *offTable,int nbSeq)

{
  ZSTD_OffsetInfo ZVar1;
  uint uVar2;
  byte bVar3;
  int in_ESI;
  long in_RDI;
  U32 u;
  U32 max;
  ZSTD_seqSymbol *table;
  U32 tableLog;
  void *ptr;
  ZSTD_OffsetInfo info;
  uint local_3c;
  uint local_38;
  uint local_8;
  uint uStack_4;
  
  memset(&local_8,0,8);
  if (in_ESI != 0) {
    bVar3 = (byte)*(uint *)(in_RDI + 4);
    uVar2 = 1 << (bVar3 & 0x1f);
    if (0x100 < uVar2) {
      __assert_fail("max <= (1 << OffFSELog)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xac5d,"ZSTD_OffsetInfo ZSTD_getOffsetInfo(const ZSTD_seqSymbol *, int)");
    }
    for (local_38 = 0; local_38 < uVar2; local_38 = local_38 + 1) {
      if (*(byte *)(in_RDI + 10 + (ulong)local_38 * 8) < uStack_4) {
        local_3c = uStack_4;
      }
      else {
        local_3c = (uint)*(byte *)(in_RDI + 10 + (ulong)local_38 * 8);
      }
      uStack_4 = local_3c;
      if (0x16 < *(byte *)(in_RDI + 10 + (ulong)local_38 * 8)) {
        local_8 = local_8 + 1;
      }
    }
    if (8 < *(uint *)(in_RDI + 4)) {
      __assert_fail("tableLog <= OffFSELog",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xac63,"ZSTD_OffsetInfo ZSTD_getOffsetInfo(const ZSTD_seqSymbol *, int)");
    }
    local_8 = local_8 << (8 - bVar3 & 0x1f);
  }
  ZVar1.maxNbAdditionalBits = uStack_4;
  ZVar1.longOffsetShare = local_8;
  return ZVar1;
}

Assistant:

static ZSTD_OffsetInfo
ZSTD_getOffsetInfo(const ZSTD_seqSymbol* offTable, int nbSeq)
{
    ZSTD_OffsetInfo info = {0, 0};
    /* If nbSeq == 0, then the offTable is uninitialized, but we have
     * no sequences, so both values should be 0.
     */
    if (nbSeq != 0) {
        const void* ptr = offTable;
        U32 const tableLog = ((const ZSTD_seqSymbol_header*)ptr)[0].tableLog;
        const ZSTD_seqSymbol* table = offTable + 1;
        U32 const max = 1 << tableLog;
        U32 u;
        DEBUGLOG(5, "ZSTD_getLongOffsetsShare: (tableLog=%u)", tableLog);

        assert(max <= (1 << OffFSELog));  /* max not too large */
        for (u=0; u<max; u++) {
            info.maxNbAdditionalBits = MAX(info.maxNbAdditionalBits, table[u].nbAdditionalBits);
            if (table[u].nbAdditionalBits > 22) info.longOffsetShare += 1;
        }

        assert(tableLog <= OffFSELog);
        info.longOffsetShare <<= (OffFSELog - tableLog);  /* scale to OffFSELog */
    }

    return info;
}